

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e4c4a4::RawDescriptor::RawDescriptor(RawDescriptor *this,CScript *script)

{
  undefined4 uVar1;
  size_type sVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  long in_FS_OFFSET;
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  local_58;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"raw","");
  DescriptorImpl::DescriptorImpl(&this->super_DescriptorImpl,&local_58,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::PubkeyProvider,_std::default_delete<(anonymous_namespace)::PubkeyProvider>_>_>_>
  ::~vector(&local_58);
  (this->super_DescriptorImpl).super_Descriptor._vptr_Descriptor =
       (_func_int **)&PTR__RawDescriptor_00b1a4c8;
  uVar1 = *(undefined4 *)((long)&(script->super_CScriptBase)._union + 4);
  sVar2 = (script->super_CScriptBase)._union.indirect_contents.capacity;
  uVar3 = *(undefined4 *)((long)&(script->super_CScriptBase)._union + 0xc);
  uVar4 = *(undefined4 *)((long)&(script->super_CScriptBase)._union + 0xc);
  uVar5 = *(undefined4 *)((long)&(script->super_CScriptBase)._union + 0x10);
  uVar6 = *(undefined4 *)((long)&(script->super_CScriptBase)._union + 0x14);
  uVar7 = *(undefined4 *)((long)&(script->super_CScriptBase)._union + 0x18);
  *(undefined4 *)&(this->m_script).super_CScriptBase._union =
       *(undefined4 *)&(script->super_CScriptBase)._union;
  *(undefined4 *)((long)&(this->m_script).super_CScriptBase._union + 4) = uVar1;
  (this->m_script).super_CScriptBase._union.indirect_contents.capacity = sVar2;
  *(undefined4 *)((long)&(this->m_script).super_CScriptBase._union + 0xc) = uVar3;
  *(undefined4 *)((long)&(this->m_script).super_CScriptBase._union + 0xc) = uVar4;
  *(undefined4 *)((long)&(this->m_script).super_CScriptBase._union + 0x10) = uVar5;
  *(undefined4 *)((long)&(this->m_script).super_CScriptBase._union + 0x14) = uVar6;
  *(undefined4 *)((long)&(this->m_script).super_CScriptBase._union + 0x18) = uVar7;
  (this->m_script).super_CScriptBase._size = (script->super_CScriptBase)._size;
  (script->super_CScriptBase)._size = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

RawDescriptor(CScript script) : DescriptorImpl({}, "raw"), m_script(std::move(script)) {}